

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

png_uint_32 reread_4(file *file)

{
  byte bVar1;
  undefined4 local_18;
  undefined4 local_14;
  int i;
  png_uint_32 result;
  file *file_local;
  
  local_14 = 0;
  local_18 = 0;
  while (local_18 = local_18 + 1, local_18 < 5) {
    bVar1 = reread_byte(file);
    local_14 = local_14 * 0x100 + (uint)bVar1;
  }
  return local_14;
}

Assistant:

static png_uint_32
reread_4(struct file *file)
   /* The same but for a four byte quantity */
{
   png_uint_32 result = 0;
   int i = 0;

   while (++i <= 4)
      result = (result << 8) + reread_byte(file);

   return result;
}